

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  bool bVar1;
  ulong uVar2;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  undefined1 auVar3 [16];
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  AlphaNum local_328;
  string local_2f8;
  AlphaNum local_2d8;
  AlphaNum local_2a8;
  AlphaNum local_278;
  undefined1 local_248 [88];
  string local_1f0;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  AlphaNum local_170;
  undefined1 local_140 [40];
  string module_name;
  string local_c0;
  AlphaNum local_a0;
  AlphaNum local_70;
  undefined1 local_40 [40];
  string *header_extension_local;
  FileDescriptor *file_local;
  ImportWriter *this_local;
  
  local_40._32_8_ = header_extension;
  header_extension_local = (string *)file;
  file_local = (FileDescriptor *)this;
  bVar1 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar1) {
    if ((this->for_bundled_proto_ & 1U) != 0) {
      absl::lts_20240722::AlphaNum::AlphaNum(&local_70,"GPB");
      FilePathBasename_abi_cxx11_(&local_c0,(objectivec *)header_extension_local,file_00);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_a0,&local_c0);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                ((AlphaNum *)((long)&module_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_40._32_8_);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_40,&local_70,&local_a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->protobuf_imports_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else {
    ModuleForFile_abi_cxx11_
              ((string *)(local_140 + 0x20),this,(FileDescriptor *)header_extension_local);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_140 + 0x20));
      absl::lts_20240722::AlphaNum::AlphaNum(&local_1a0,"/");
      FilePathBasename_abi_cxx11_(&local_1f0,(objectivec *)header_extension_local,file_01);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1d0,&local_1f0);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                ((AlphaNum *)(local_248 + 0x28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_40._32_8_);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_140,&local_170,&local_1a0,&local_1d0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&local_1f0);
      local_248[0x24] = '\x01';
      local_248[0x25] = '\0';
      local_248[0x26] = '\0';
      local_248[0x27] = '\0';
    }
    else {
      auVar3 = std::__cxx11::string::empty();
      if ((auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_278,&this->generate_for_named_framework_);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_2a8,"/");
        FilePathBasename_abi_cxx11_(&local_2f8,(objectivec *)header_extension_local,file_02);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2d8,&local_2f8);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_40._32_8_);
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)local_248,&local_278,&local_2a8,&local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->other_framework_imports_,(value_type *)local_248);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)&local_2f8);
        local_248[0x24] = '\x01';
        local_248[0x25] = '\0';
        local_248[0x26] = '\0';
        local_248[0x27] = '\0';
      }
      else {
        FilePath_abi_cxx11_(&local_368,(objectivec *)header_extension_local,auVar3._8_8_);
        std::operator+(&local_348,&local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_40._32_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->other_imports_,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        local_248[0x24] = '\0';
        local_248[0x25] = '\0';
        local_248[0x26] = '\0';
        local_248[0x27] = '\0';
      }
    }
    std::__cxx11::string::~string((string *)(local_140 + 0x20));
  }
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (for_bundled_proto_) {
      protobuf_imports_.emplace_back(
          absl::StrCat("GPB", FilePathBasename(file), header_extension));
    }
    return;
  }

  auto module_name = ModuleForFile(file);

  if (!module_name.empty()) {
    other_framework_imports_.emplace_back(absl::StrCat(
        module_name, "/", FilePathBasename(file), header_extension));
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        absl::StrCat(generate_for_named_framework_, "/", FilePathBasename(file),
                     header_extension));
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}